

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O1

bool __thiscall Fossilize::ApplicationInfoFilter::Impl::filter_env_info(Impl *this,EnvInfo *info)

{
  int iVar1;
  char *pcVar2;
  
  if ((this->getenv_wrapper != (_func_char_ptr_char_ptr_void_ptr *)0x0) &&
     (pcVar2 = (*this->getenv_wrapper)((info->env)._M_dataplus._M_p,this->getenv_userdata),
     pcVar2 != (char *)0x0)) {
    if (info->nonnull != false) {
      return true;
    }
    if (((info->equals)._M_string_length != 0) &&
       (iVar1 = std::__cxx11::string::compare((char *)&info->equals), iVar1 == 0)) {
      return true;
    }
    if (((info->contains)._M_string_length != 0) &&
       (pcVar2 = strstr(pcVar2,(info->contains)._M_dataplus._M_p), pcVar2 != (char *)0x0)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool ApplicationInfoFilter::Impl::filter_env_info(const EnvInfo &info) const
{
	if (!getenv_wrapper)
		return false;

	const char *env = getenv_wrapper(info.env.c_str(), getenv_userdata);
	if (!env)
		return false;

	if (info.nonnull)
		return true;
	else if (!info.equals.empty() && info.equals == env)
		return true;
	else if (!info.contains.empty() && strstr(env, info.contains.c_str()))
		return true;
	else
		return false;
}